

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

void __thiscall dgPolyhedra::Optimize(dgPolyhedra *this,HaF64 *array,HaI32 strideInBytes,HaF64 tol)

{
  double dVar1;
  undefined1 auVar2 [16];
  HaI32 i2;
  HaI32 HVar3;
  HaI32 HVar4;
  HaI32 *pHVar5;
  dgEdge *pdVar6;
  dgEdge *pdVar7;
  byte bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [56];
  dgListNode *pdVar26;
  undefined8 uVar27;
  dgRedBackNode *pdVar28;
  dgVertexCollapseVertexMetric *__s;
  RECORD *pRVar29;
  dgPolyhedra *pdVar30;
  dgBigVector *pdVar31;
  dgTemplateVector<double> *pdVar32;
  dgTreeNode *node;
  dgTreeNode *pdVar33;
  dgEdge *pdVar34;
  dgEdge *pdVar35;
  char *__function;
  dgEdge *pdVar36;
  dgEdge *pdVar37;
  uint uVar38;
  dgRedBackNode *pdVar39;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  dgEdge *pdVar40;
  dgEdge **ppdVar41;
  ulong uVar42;
  long in_R8;
  ulong uVar43;
  dgEdge *pdVar44;
  int iVar45;
  size_t sVar46;
  dgEdge *pdVar47;
  int iVar48;
  ulong uVar49;
  long lVar50;
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  HaF64 HVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  dgStack<dgBigVector> vertexPool;
  dgBigPlane constrainPlane;
  dgListNode *handleNodePtr;
  dgStack<dgVertexCollapseVertexMetric> vertexMetrics;
  dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double> bigHeapArray;
  dgList<dgEdgeCollapseEdgeHandle> edgeHandleList;
  dgStack<dgBigVector> local_140;
  dgEdge *local_130;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  double dStack_118;
  double dStack_110;
  dgBigVector *local_100;
  dgListNode *local_f8;
  dgStack<dgVertexCollapseVertexMetric> local_f0;
  dgEdge *local_e0;
  dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double> local_d8;
  dgEdgeCollapseEdgeHandle local_c8;
  RECORD *local_b8;
  undefined1 local_b0 [32];
  _func_int **local_90;
  dgEdge *local_88;
  undefined1 local_80 [16];
  undefined1 auStack_70 [48];
  undefined1 local_40 [16];
  undefined1 auVar60 [64];
  
  iVar45 = (this->super_dgTree<dgEdge,_long>).m_count;
  local_80._8_8_ = this;
  uVar43 = 0;
  pdVar33 = (this->super_dgTree<dgEdge,_long>).m_head;
  if (pdVar33 != (dgTreeNode *)0x0) {
    pdVar28 = dgRedBackNode::Minimum(&pdVar33->super_dgRedBackNode);
    local_80._0_8_ = pdVar28;
    if (pdVar28 != (dgRedBackNode *)0x0) {
      iVar48 = -1;
      do {
        if (iVar48 < *(int *)&pdVar28[1]._vptr_dgRedBackNode) {
          iVar48 = *(int *)&pdVar28[1]._vptr_dgRedBackNode;
        }
        dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)local_80,0);
        pdVar28 = (dgRedBackNode *)local_80._0_8_;
      } while ((dgRedBackNode *)local_80._0_8_ != (dgRedBackNode *)0x0);
      uVar43 = (ulong)(iVar48 + 1);
    }
  }
  iVar48 = (int)uVar43;
  local_e0 = (dgEdge *)this;
  local_140.super_dgStackBase.m_ptr = malloc((long)(iVar48 << 5));
  local_140.m_size = iVar48;
  local_100 = (dgBigVector *)local_140.super_dgStackBase.m_ptr;
  __s = (dgVertexCollapseVertexMetric *)malloc((long)((iVar48 + 0x200) * 0x50));
  uVar38 = iVar45 * 0xa0 + 0xa0000;
  sVar46 = (size_t)(int)uVar38;
  local_b0._0_8_ = &PTR__dgList_00b42b80;
  local_b0._8_4_ = 0;
  local_90 = (_func_int **)&PTR__dgList_00b42b80;
  local_b0._16_16_ = (undefined1  [16])0x0;
  local_f0.super_dgStackBase.m_ptr = __s;
  local_f0.m_size = iVar48 + 0x200;
  pRVar29 = (RECORD *)malloc(sVar46);
  if ((int)uVar38 < 0) {
    __function = "T &dgStack<char>::operator[](hacd::HaI32) [T = char]";
    goto LAB_0085c231;
  }
  local_d8.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.m_maxCount =
       uVar38 >> 4;
  local_d8.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.m_curCount = 0;
  if (iVar48 == 0) {
    sVar46 = 0;
  }
  else {
    auVar53 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar54 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar55 = vpbroadcastq_avx512f();
    uVar49 = (ulong)(iVar48 + 7U & 0xfffffff8);
    auVar56 = vpbroadcastq_avx512f();
    auVar57 = vpbroadcastq_avx512f();
    auVar58 = vpbroadcastq_avx512f();
    do {
      auVar59 = vpmullq_avx512dq(auVar53,auVar57);
      uVar42 = vpcmpuq_avx512f(auVar53,auVar56,2);
      uVar49 = uVar49 - 8;
      auVar60 = vgatherqpd_avx512f(array[sVar46]);
      bVar8 = (byte)uVar42;
      auVar61._8_8_ = (ulong)((byte)(uVar42 >> 1) & 1) * auVar60._8_8_;
      auVar61._0_8_ = (ulong)(bVar8 & 1) * auVar60._0_8_;
      auVar61._16_8_ = (ulong)((byte)(uVar42 >> 2) & 1) * auVar60._16_8_;
      auVar61._24_8_ = (ulong)((byte)(uVar42 >> 3) & 1) * auVar60._24_8_;
      auVar61._32_8_ = (ulong)((byte)(uVar42 >> 4) & 1) * auVar60._32_8_;
      auVar61._40_8_ = (ulong)((byte)(uVar42 >> 5) & 1) * auVar60._40_8_;
      auVar61._48_8_ = (ulong)((byte)(uVar42 >> 6) & 1) * auVar60._48_8_;
      auVar61._56_8_ = (uVar42 >> 7) * auVar60._56_8_;
      auVar59 = vpsllq_avx512f(auVar59,3);
      auVar60 = vpsllq_avx512f(auVar53,5);
      auVar53 = vpaddq_avx512f(auVar53,auVar54);
      vpaddq_avx512f(auVar55,auVar59);
      auVar59 = vpaddq_avx512f(auVar58,auVar60);
      vscatterqpd_avx512f(ZEXT864(local_100) + auVar60,uVar42,auVar61);
      auVar60 = vgatherqpd_avx512f(*(undefined8 *)(in_R8 + 8));
      auVar62._8_8_ = (ulong)((byte)(uVar42 >> 1) & 1) * auVar60._8_8_;
      auVar62._0_8_ = (ulong)(bVar8 & 1) * auVar60._0_8_;
      auVar62._16_8_ = (ulong)((byte)(uVar42 >> 2) & 1) * auVar60._16_8_;
      auVar62._24_8_ = (ulong)((byte)(uVar42 >> 3) & 1) * auVar60._24_8_;
      auVar62._32_8_ = (ulong)((byte)(uVar42 >> 4) & 1) * auVar60._32_8_;
      auVar62._40_8_ = (ulong)((byte)(uVar42 >> 5) & 1) * auVar60._40_8_;
      auVar62._48_8_ = (ulong)((byte)(uVar42 >> 6) & 1) * auVar60._48_8_;
      auVar62._56_8_ = (uVar42 >> 7) * auVar60._56_8_;
      vscatterqpd_avx512f(ZEXT864(8) + auVar59,uVar42,auVar62);
      auVar60 = vgatherqpd_avx512f(*(undefined8 *)(in_R8 + 0x10));
      auVar63._8_8_ = (ulong)((byte)(uVar42 >> 1) & 1) * auVar60._8_8_;
      auVar63._0_8_ = (ulong)(bVar8 & 1) * auVar60._0_8_;
      auVar63._16_8_ = (ulong)((byte)(uVar42 >> 2) & 1) * auVar60._16_8_;
      auVar63._24_8_ = (ulong)((byte)(uVar42 >> 3) & 1) * auVar60._24_8_;
      auVar63._32_8_ = (ulong)((byte)(uVar42 >> 4) & 1) * auVar60._32_8_;
      auVar63._40_8_ = (ulong)((byte)(uVar42 >> 5) & 1) * auVar60._40_8_;
      auVar63._48_8_ = (ulong)((byte)(uVar42 >> 6) & 1) * auVar60._48_8_;
      auVar63._56_8_ = (uVar42 >> 7) * auVar60._56_8_;
      vscatterqpd_avx512f(ZEXT864(0x10) + auVar59,uVar42,auVar63);
      vscatterqpd_avx512f(ZEXT864(0x18) + auVar59,uVar42,ZEXT864(0) << 0x40);
    } while (uVar49 != 0);
    sVar46 = uVar43 * 0x50;
  }
  local_d8.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.m_pool = pRVar29
  ;
  local_b8 = pRVar29;
  memset(__s,0,sVar46);
  iVar45 = *(HaI32 *)((long)&local_e0->m_prev + 4) + 1;
  *(int *)((long)&local_e0->m_prev + 4) = iVar45;
  if (iVar45 == 0x7fffffff) {
LAB_0085c2ed:
    __assert_fail("m_edgeMark < 0x7fffffff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                  ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
  }
  local_c8.m_edge = local_e0;
  if ((dgTreeNode *)local_e0->m_next == (dgTreeNode *)0x0) {
    local_80._8_8_ = local_e0;
    auVar25 = stack0xffffffffffffff88;
  }
  else {
    local_c8._0_8_ = dgRedBackNode::Minimum((dgRedBackNode *)local_e0->m_next);
    if ((dgRedBackNode *)local_c8._0_8_ != (dgRedBackNode *)0x0) {
      do {
        uVar27 = local_c8._0_8_;
        if (*(int *)&((dgRedBackNode *)(local_c8._0_8_ + 0x50))->_vptr_dgRedBackNode != iVar45) {
          if (*(int *)((long)&((dgRedBackNode *)(local_c8._0_8_ + 0x28))->_vptr_dgRedBackNode + 4) <
              1) {
            pHVar5 = *(HaI32 **)&((dgRedBackNode *)(local_c8._0_8_ + 0x28))->field_0x20;
            if (pHVar5[1] < 1) {
              __assert_fail("edge->m_twin->m_incidentFace > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                            ,0x993,
                            "void CalculateAllMetrics(const dgPolyhedra *const, dgVertexCollapseVertexMetric *const, const dgBigVector *const)"
                           );
            }
            HVar3 = *pHVar5;
            HVar4 = **(HaI32 **)(pHVar5 + 4);
            i2 = **(HaI32 **)(pHVar5 + 6);
            *(int *)&((dgRedBackNode *)(local_c8._0_8_ + 0x50))->_vptr_dgRedBackNode = iVar45;
            UnboundedLoopPlane((dgBigPlane *)local_128,HVar3,HVar4,i2,local_100);
            auVar53 = vpermpd_avx512f(_DAT_009e2600,
                                      ZEXT3264(CONCAT824(dStack_110,
                                                         CONCAT816(dStack_118,
                                                                   CONCAT412(fStack_11c,
                                                                             CONCAT48(fStack_120,
                                                                                      CONCAT44(
                                                  local_128._4_4_,local_128._0_4_)))))));
            dVar1 = (double)CONCAT44(local_128._4_4_,local_128._0_4_);
            auVar52._8_4_ = fStack_120;
            auVar52._0_8_ = dVar1;
            auVar52._12_4_ = fStack_11c;
            auVar24._8_8_ = dStack_110;
            auVar24._0_8_ = dStack_118;
            auVar51 = vshufpd_avx(auVar52,auVar24,1);
            auVar68._8_8_ = 0;
            auVar68._0_8_ = dVar1 + dVar1;
            vbroadcastsd_avx512f(auVar68);
            auVar66._0_8_ = auVar51._0_8_ + auVar51._0_8_;
            auVar66._8_8_ = auVar51._8_8_ + auVar51._8_8_;
            auVar54 = vpermt2pd_avx512f(_DAT_009e2640,ZEXT1664(auVar66));
            auVar51._8_4_ = SUB84(dStack_110,0);
            auVar51._0_8_ = dStack_110;
            auVar51._12_4_ = (int)((ulong)dStack_110 >> 0x20);
            local_40 = vmulpd_avx512vl(auVar66,auVar51);
            _local_80 = vmulpd_avx512f(auVar54,auVar53);
            dgVertexCollapseVertexMetric::Accumulate
                      (__s + *(int *)&((dgRedBackNode *)(uVar27 + 0x28))->_vptr_dgRedBackNode,
                       (dgVertexCollapseVertexMetric *)local_80);
            dgVertexCollapseVertexMetric::Accumulate
                      (__s + **(int **)&((dgRedBackNode *)(uVar27 + 0x28))->field_0x20,
                       (dgVertexCollapseVertexMetric *)local_80);
          }
          else {
            pdVar28 = (dgRedBackNode *)(local_c8._0_8_ + 0x28);
            EdgePlane((dgBigPlane *)local_128,
                      *(HaI32 *)&((dgRedBackNode *)(local_c8._0_8_ + 0x28))->_vptr_dgRedBackNode,
                      *(HaI32 *)&((dgRedBackNode *)(local_c8._0_8_ + 0x28))->m_right->
                                 _vptr_dgRedBackNode,
                      *(HaI32 *)&((dgRedBackNode *)(local_c8._0_8_ + 0x28))->m_parent->
                                 _vptr_dgRedBackNode,local_100);
            auVar53 = vpermpd_avx512f(_DAT_009e2600,
                                      ZEXT3264(CONCAT824(dStack_110,
                                                         CONCAT816(dStack_118,
                                                                   CONCAT412(fStack_11c,
                                                                             CONCAT48(fStack_120,
                                                                                      CONCAT44(
                                                  local_128._4_4_,local_128._0_4_)))))));
            dVar1 = (double)CONCAT44(local_128._4_4_,local_128._0_4_);
            auVar22._8_4_ = fStack_120;
            auVar22._0_8_ = dVar1;
            auVar22._12_4_ = fStack_11c;
            auVar23._8_8_ = dStack_110;
            auVar23._0_8_ = dStack_118;
            auVar51 = vshufpd_avx(auVar22,auVar23,1);
            auVar67._8_8_ = 0;
            auVar67._0_8_ = dVar1 + dVar1;
            vbroadcastsd_avx512f(auVar67);
            auVar65._0_8_ = auVar51._0_8_ + auVar51._0_8_;
            auVar65._8_8_ = auVar51._8_8_ + auVar51._8_8_;
            auVar54 = vpermt2pd_avx512f(_DAT_009e2640,ZEXT1664(auVar65));
            auVar9._8_4_ = SUB84(dStack_110,0);
            auVar9._0_8_ = dStack_110;
            auVar9._12_4_ = (int)((ulong)dStack_110 >> 0x20);
            local_40 = vmulpd_avx512vl(auVar65,auVar9);
            _local_80 = vmulpd_avx512f(auVar54,auVar53);
            pdVar39 = pdVar28;
            do {
              *(int *)&pdVar39[1]._vptr_dgRedBackNode = iVar45;
              dgVertexCollapseVertexMetric::Accumulate
                        (__s + *(int *)&pdVar39->_vptr_dgRedBackNode,
                         (dgVertexCollapseVertexMetric *)local_80);
              pdVar39 = pdVar39->m_right;
            } while (pdVar39 != pdVar28);
          }
        }
        dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)&local_c8,0);
      } while ((dgRedBackNode *)local_c8._0_8_ != (dgRedBackNode *)0x0);
    }
    auVar25._8_48_ = auStack_70;
    auVar25._0_8_ = local_e0;
    auVar53._56_8_ = 0;
    auVar53._0_56_ = auVar25;
    _local_80 = auVar53 << 0x40;
    if ((dgTreeNode *)local_e0->m_next != (dgTreeNode *)0x0) {
      pdVar28 = dgRedBackNode::Minimum((dgRedBackNode *)local_e0->m_next);
      goto LAB_0085b731;
    }
  }
  stack0xffffffffffffff88 = auVar25;
  pdVar28 = (dgRedBackNode *)0x0;
LAB_0085b731:
  local_80._0_8_ = pdVar28;
  local_100 = (dgBigVector *)((double)tol * (double)tol);
  if (pdVar28 != (dgRedBackNode *)0x0) {
    do {
      pdVar28[1].m_left = (dgRedBackNode *)0x0;
      HVar3 = **(HaI32 **)&pdVar28[1].field_0x20;
      pdVar30 = (dgPolyhedra *)
                dgStack<dgVertexCollapseVertexMetric>::operator[]
                          (&local_f0,*(HaI32 *)&pdVar28[1]._vptr_dgRedBackNode);
      pdVar31 = dgStack<dgBigVector>::operator[](&local_140,HVar3);
      dVar1 = (pdVar31->super_dgTemplateVector<double>).m_z;
      auVar2._0_8_ = (pdVar31->super_dgTemplateVector<double>).m_x;
      auVar2._8_8_ = (pdVar31->super_dgTemplateVector<double>).m_y;
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0x7fffffffffffffff;
      auVar10._12_4_ = 0x7fffffff;
      auVar51 = vpandq_avx512vl(auVar2,auVar10);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0x7fefffffffffffff;
      auVar11._12_4_ = 0x7fefffff;
      uVar43 = vpcmpgtq_avx512vl(auVar51,auVar11);
      if (((((uVar43 & 1) != 0) || ((uVar43 & 3) >> 1 != 0)) ||
          (NAN((pdVar31->super_dgTemplateVector<double>).m_y))) ||
         ((0x7fefffffffffffff < (ulong)ABS(dVar1) || (NAN(dVar1))))) {
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x152,"dgBigVector::dgBigVector(const hacd::HaF64 *)");
      }
      auVar51 = vcvtpd2ps_avx(auVar2);
      auVar12._8_4_ = 0x7fffffff;
      auVar12._0_8_ = 0x7fffffff7fffffff;
      auVar12._12_4_ = 0x7fffffff;
      auVar52 = vpandd_avx512vl(auVar51,auVar12);
      fStack_120 = (float)dVar1;
      auVar13._8_4_ = 0x7f7fffff;
      auVar13._0_8_ = 0x7f7fffff7f7fffff;
      auVar13._12_4_ = 0x7f7fffff;
      uVar43 = vpcmpgtd_avx512vl(auVar52,auVar13);
      local_128._0_4_ = auVar51._0_4_;
      local_128._4_4_ = auVar51._4_4_;
      fStack_11c = 0.0;
      if ((((uVar43 & 1) != 0) || (((uVar43 & 0xf) >> 1 & 1) != 0)) ||
         ((auVar51 = vmovshdup_avx(auVar51), NAN(auVar51._0_4_) ||
          ((0x7f7fffff < (uint)ABS(fStack_120) || (NAN(fStack_120))))))) goto LAB_0085c1fd;
      HVar64 = dgVertexCollapseVertexMetric::Evalue
                         ((dgVertexCollapseVertexMetric *)pdVar30,(dgVector *)local_128);
      if ((double)HVar64 < (double)local_100) {
        if (local_140.m_size < 0) goto LAB_0085c21c;
        HVar64 = EdgePenalty(pdVar30,(dgBigVector *)local_140.super_dgStackBase.m_ptr,
                             (dgEdge *)(pdVar28 + 1));
        if (0.0 < (double)HVar64) {
          local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
          local_c8.m_edge = (dgEdge *)(pdVar28 + 1);
          local_f8 = dgList<dgEdgeCollapseEdgeHandle>::Addtop
                               ((dgList<dgEdgeCollapseEdgeHandle> *)local_b0,&local_c8);
          dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Push
                    (&local_d8,&local_f8,(double)HVar64);
          if (((local_c8.m_inList != 0) && (local_c8.m_edge != (dgEdge *)0x0)) &&
             (&local_c8 == (dgEdgeCollapseEdgeHandle *)(local_c8.m_edge)->m_userData)) {
            (local_c8.m_edge)->m_userData = 0;
          }
        }
      }
      dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)local_80,0);
      pdVar28 = (dgRedBackNode *)local_80._0_8_;
    } while ((dgRedBackNode *)local_80._0_8_ != (dgRedBackNode *)0x0);
  }
LAB_0085c19c:
  do {
    if (local_d8.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.m_curCount
        == 0) {
      free(local_d8.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.m_pool)
      ;
      free(local_b8);
      local_b0._0_8_ = local_90;
      dgList<dgEdgeCollapseEdgeHandle>::RemoveAll((dgList<dgEdgeCollapseEdgeHandle> *)local_b0);
      free(local_f0.super_dgStackBase.m_ptr);
      free(local_140.super_dgStackBase.m_ptr);
      return;
    }
    if (local_d8.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.m_curCount
        < 0) {
      __assert_fail("i<= m_curCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgHeap.h"
                    ,0xcd,
                    "const OBJECT &dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode *, double>::operator[](hacd::HaI32) const [OBJECT = dgList<dgEdgeCollapseEdgeHandle>::dgListNode *, KEY = double]"
                   );
    }
    local_f8 = *(dgListNode **)
                (local_d8.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.
                 m_pool + 8);
    pdVar47 = (local_f8->m_info).m_edge;
    dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Pop(&local_d8);
    pdVar26 = local_f8;
    dgList<dgEdgeCollapseEdgeHandle>::Unlink((dgList<dgEdgeCollapseEdgeHandle> *)local_b0,local_f8);
    if (pdVar26 != (dgListNode *)0x0) {
      (*pdVar26->_vptr_dgListNode[1])(pdVar26);
    }
  } while (pdVar47 == (dgEdge *)0x0);
  if (local_f0.m_size < 0) goto LAB_0085c23b;
  if (-1 < local_140.m_size) {
    CalculateVertexMetrics
              ((dgVertexCollapseVertexMetric *)local_f0.super_dgStackBase.m_ptr,
               (dgBigVector *)local_140.super_dgStackBase.m_ptr,pdVar47);
    HVar3 = pdVar47->m_twin->m_incidentVertex;
    pdVar30 = (dgPolyhedra *)
              dgStack<dgVertexCollapseVertexMetric>::operator[](&local_f0,pdVar47->m_incidentVertex)
    ;
    pdVar32 = &dgStack<dgBigVector>::operator[](&local_140,HVar3)->super_dgTemplateVector<double>;
    auVar51 = vcvtpd2ps_avx((undefined1  [32])*pdVar32);
    auVar14._8_4_ = 0x7fffffff;
    auVar14._0_8_ = 0x7fffffff7fffffff;
    auVar14._12_4_ = 0x7fffffff;
    auVar52 = vpandd_avx512vl(auVar51,auVar14);
    auVar15._8_4_ = 0x7f7fffff;
    auVar15._0_8_ = 0x7f7fffff7f7fffff;
    auVar15._12_4_ = 0x7f7fffff;
    uVar43 = vpcmpgtd_avx512vl(auVar52,auVar15);
    local_128._0_4_ = auVar51._0_4_;
    local_128._4_4_ = auVar51._4_4_;
    fStack_120 = auVar51._8_4_;
    fStack_11c = auVar51._12_4_;
    if (((uVar43 & 0xf) == 0) && (auVar52 = vmovshdup_avx(auVar51), !NAN(auVar52._0_4_))) {
      auVar52 = vshufpd_avx(auVar51,auVar51,1);
      auVar51 = vshufps_avx(auVar51,auVar51,0xff);
      if (!NAN(auVar52._0_4_) && !NAN(auVar51._0_4_)) goto code_r0x0085ba3e;
    }
LAB_0085c1fd:
    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                  ,0x12d,"dgVector::dgVector(const dgBigVector &)");
  }
  goto LAB_0085c21c;
code_r0x0085ba3e:
  HVar64 = dgVertexCollapseVertexMetric::Evalue
                     ((dgVertexCollapseVertexMetric *)pdVar30,(dgVector *)local_128);
  if ((double)local_100 <= (double)HVar64) goto LAB_0085c19c;
  if (local_140.m_size < 0) goto LAB_0085c21c;
  HVar64 = EdgePenalty(pdVar30,(dgBigVector *)local_140.super_dgStackBase.m_ptr,pdVar47);
  pdVar34 = local_e0;
  if ((double)HVar64 <= 0.0) goto LAB_0085c19c;
  pdVar35 = pdVar47->m_twin;
  pdVar37 = pdVar35->m_prev;
  pdVar6 = pdVar35->m_next;
  pdVar7 = pdVar37->m_twin;
  if (pdVar7 == pdVar35 || pdVar7 == pdVar6) goto LAB_0085c19c;
  iVar45 = pdVar47->m_incidentVertex;
  iVar48 = pdVar35->m_incidentVertex;
  local_130 = pdVar7;
  if ((pdVar7 == pdVar47->m_next) &&
     (local_130 = pdVar47->m_prev->m_twin, local_130 == pdVar35 || local_130 == pdVar6))
  goto LAB_0085c19c;
  if (pdVar47->m_incidentFace < 0) {
    if (pdVar35->m_incidentFace < 0) goto LAB_0085bb14;
    pdVar40 = pdVar6->m_twin;
    pdVar36 = pdVar47;
  }
  else {
    if (pdVar35->m_incidentFace < 0) {
LAB_0085bb14:
      pdVar36 = pdVar47->m_prev->m_twin;
      ppdVar41 = &pdVar35->m_next;
      goto LAB_0085bb20;
    }
    pdVar40 = pdVar6->m_twin;
    pdVar36 = pdVar47->m_prev->m_twin;
  }
  ppdVar41 = &pdVar40->m_next;
LAB_0085bb20:
  pdVar40 = *ppdVar41;
  uVar43 = (ulong)iVar48;
  if (pdVar40 != pdVar36) {
    do {
      if (local_e0->m_next != (dgEdge *)0x0) {
        uVar49 = (long)pdVar40->m_twin->m_incidentVertex | uVar43 << 0x20;
        pdVar44 = local_e0->m_next;
        do {
          lVar50 = 8;
          if ((*(long *)&pdVar44[1].m_mark <= (long)uVar49) &&
             (lVar50 = 0x10, (long)uVar49 <= *(long *)&pdVar44[1].m_mark)) goto LAB_0085c19c;
          pdVar44 = *(dgEdge **)((long)&pdVar44->m_incidentVertex + lVar50);
        } while (pdVar44 != (dgEdge *)0x0);
      }
      pdVar40 = pdVar40->m_twin->m_next;
    } while (pdVar40 != pdVar36);
  }
  if (pdVar6 == pdVar37->m_prev) {
    pdVar6 = pdVar6->m_twin;
    pdVar7->m_twin = pdVar6;
    pdVar6->m_twin = pdVar37->m_twin;
    RemoveHalfEdge((dgPolyhedra *)local_e0,pdVar37);
    RemoveHalfEdge((dgPolyhedra *)pdVar34,pdVar35->m_next);
  }
  else {
    pdVar6->m_prev = pdVar37;
    pdVar35->m_prev->m_next = pdVar6;
  }
  pdVar37 = pdVar47->m_next;
  pdVar6 = pdVar47->m_prev;
  if (pdVar37 == pdVar6->m_prev) {
    pdVar6 = pdVar6->m_twin;
    pdVar37->m_twin->m_twin = pdVar6;
    pdVar6->m_twin = pdVar37->m_twin;
    RemoveHalfEdge((dgPolyhedra *)pdVar34,pdVar37);
    RemoveHalfEdge((dgPolyhedra *)pdVar34,pdVar47->m_prev);
  }
  else {
    pdVar37->m_prev = pdVar6;
    pdVar47->m_prev->m_next = pdVar37;
  }
  if (pdVar35->m_twin->m_incidentVertex != iVar45) {
    __assert_fail("twin->m_twin->m_incidentVertex == v0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0xaa0,"dgEdge *CollapseEdge(dgPolyhedra *const, dgEdge *const)");
  }
  if (pdVar47->m_twin->m_incidentVertex != iVar48) {
    __assert_fail("edge->m_twin->m_incidentVertex == v1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0xaa1,"dgEdge *CollapseEdge(dgPolyhedra *const, dgEdge *const)");
  }
  RemoveHalfEdge((dgPolyhedra *)pdVar34,pdVar35);
  RemoveHalfEdge((dgPolyhedra *)pdVar34,pdVar47);
  pdVar47 = local_130;
  do {
    pdVar35 = pdVar47->m_twin;
    pdVar33 = (dgTreeNode *)pdVar34->m_next;
    if (pdVar33 != (dgTreeNode *)0x0) {
      uVar49 = (ulong)pdVar35->m_incidentVertex;
      uVar42 = (long)iVar45 << 0x20 | uVar49;
      node = pdVar33;
      do {
        lVar50 = 8;
        if ((node->m_key <= (long)uVar42) && (lVar50 = 0x10, (long)uVar42 <= node->m_key)) {
          if (&node->m_info == pdVar47) {
            pdVar47->m_incidentVertex = iVar48;
            pdVar33 = dgTree<dgEdge,_long>::ReplaceKey
                                ((dgTree<dgEdge,_long> *)pdVar34,node,uVar49 | uVar43 << 0x20);
            if (pdVar33 == (dgTreeNode *)0x0) {
              __assert_fail("node",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                            ,0xaaf,"dgEdge *CollapseEdge(dgPolyhedra *const, dgEdge *const)");
            }
            pdVar35 = pdVar47->m_twin;
            pdVar33 = (dgTreeNode *)pdVar34->m_next;
            uVar49 = (ulong)pdVar35->m_incidentVertex;
          }
          break;
        }
        node = *(dgTreeNode **)((long)&(node->super_dgRedBackNode)._vptr_dgRedBackNode + lVar50);
      } while (node != (dgTreeNode *)0x0);
      if (pdVar33 != (dgTreeNode *)0x0) {
        uVar42 = uVar49 << 0x20 | (long)iVar45;
        do {
          lVar50 = 8;
          if ((pdVar33->m_key <= (long)uVar42) && (lVar50 = 0x10, (long)uVar42 <= pdVar33->m_key)) {
            if (&pdVar33->m_info == pdVar35) {
              pdVar33 = dgTree<dgEdge,_long>::ReplaceKey
                                  ((dgTree<dgEdge,_long> *)pdVar34,pdVar33,uVar49 << 0x20 | uVar43);
              if (pdVar33 == (dgTreeNode *)0x0) {
                __assert_fail("node",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                              ,0xab9,"dgEdge *CollapseEdge(dgPolyhedra *const, dgEdge *const)");
              }
              pdVar35 = pdVar47->m_twin;
            }
            break;
          }
          pdVar33 = *(dgTreeNode **)
                     ((long)&(pdVar33->super_dgRedBackNode)._vptr_dgRedBackNode + lVar50);
        } while (pdVar33 != (dgTreeNode *)0x0);
      }
    }
    pdVar6 = local_e0;
    pdVar37 = local_130;
    pdVar47 = pdVar35->m_next;
  } while (pdVar47 != local_130);
  if (local_130 != (dgEdge *)0x0) {
    if (local_f0.m_size < 0) {
LAB_0085c23b:
      __function = 
      "T &dgStack<dgVertexCollapseVertexMetric>::operator[](hacd::HaI32) [T = dgVertexCollapseVertexMetric]"
      ;
      goto LAB_0085c231;
    }
    if (local_140.m_size < 0) goto LAB_0085c21c;
    CalculateVertexMetrics
              ((dgVertexCollapseVertexMetric *)local_f0.super_dgStackBase.m_ptr,
               (dgBigVector *)local_140.super_dgStackBase.m_ptr,local_130);
    do {
      if (local_f0.m_size < 0) goto LAB_0085c23b;
      if (local_140.m_size < 0) goto LAB_0085c21c;
      CalculateVertexMetrics
                ((dgVertexCollapseVertexMetric *)local_f0.super_dgStackBase.m_ptr,
                 (dgBigVector *)local_140.super_dgStackBase.m_ptr,pdVar37->m_twin);
      pdVar37 = pdVar37->m_twin->m_next;
    } while (pdVar37 != local_130);
    iVar45 = *(HaI32 *)((long)&pdVar6->m_prev + 4) + 1;
    *(int *)((long)&pdVar6->m_prev + 4) = iVar45;
    pdVar47 = local_130;
    if (iVar45 == 0x7fffffff) goto LAB_0085c2ed;
    do {
      if (pdVar47->m_mark == iVar45) {
        __assert_fail("ptr->m_mark != mark",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0xb1f,
                      "void dgPolyhedra::Optimize(const hacd::HaF64 *const, hacd::HaI32, hacd::HaF64)"
                     );
      }
      pdVar47->m_mark = iVar45;
      HVar3 = pdVar47->m_twin->m_incidentVertex;
      pdVar30 = (dgPolyhedra *)
                dgStack<dgVertexCollapseVertexMetric>::operator[]
                          (&local_f0,pdVar47->m_incidentVertex);
      pdVar32 = &dgStack<dgBigVector>::operator[](&local_140,HVar3)->super_dgTemplateVector<double>;
      auVar51 = vcvtpd2ps_avx((undefined1  [32])*pdVar32);
      auVar16._8_4_ = 0x7fffffff;
      auVar16._0_8_ = 0x7fffffff7fffffff;
      auVar16._12_4_ = 0x7fffffff;
      auVar52 = vpandd_avx512vl(auVar51,auVar16);
      auVar17._8_4_ = 0x7f7fffff;
      auVar17._0_8_ = 0x7f7fffff7f7fffff;
      auVar17._12_4_ = 0x7f7fffff;
      uVar43 = vpcmpgtd_avx512vl(auVar52,auVar17);
      local_128._0_4_ = auVar51._0_4_;
      local_128._4_4_ = auVar51._4_4_;
      fStack_120 = auVar51._8_4_;
      fStack_11c = auVar51._12_4_;
      if (((uVar43 & 0xf) != 0) || (auVar52 = vmovshdup_avx(auVar51), NAN(auVar52._0_4_)))
      goto LAB_0085c1fd;
      auVar52 = vshufpd_avx(auVar51,auVar51,1);
      auVar51 = vshufps_avx(auVar51,auVar51,0xff);
      if (NAN(auVar52._0_4_) || NAN(auVar51._0_4_)) goto LAB_0085c1fd;
      HVar64 = dgVertexCollapseVertexMetric::Evalue
                         ((dgVertexCollapseVertexMetric *)pdVar30,(dgVector *)local_128);
      if ((double)local_100 <= (double)HVar64) {
LAB_0085beb9:
        if (pdVar47->m_userData != 0) {
          *(undefined8 *)(pdVar47->m_userData + 8) = 0;
        }
        pdVar47->m_userData = 0;
      }
      else {
        if (local_140.m_size < 0) goto LAB_0085c21c;
        HVar64 = EdgePenalty(pdVar30,(dgBigVector *)local_140.super_dgStackBase.m_ptr,pdVar47);
        if ((double)HVar64 <= 0.0) goto LAB_0085beb9;
        local_128._0_4_ = 0.0;
        fStack_120 = SUB84(pdVar47,0);
        fStack_11c = (float)((ulong)pdVar47 >> 0x20);
        local_f8 = dgList<dgEdgeCollapseEdgeHandle>::Addtop
                             ((dgList<dgEdgeCollapseEdgeHandle> *)local_b0,
                              (dgEdgeCollapseEdgeHandle *)local_128);
        dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Push
                  (&local_d8,&local_f8,(double)HVar64);
        if ((((float)local_128._0_4_ != 0.0) &&
            (lVar50 = CONCAT44(fStack_11c,fStack_120), lVar50 != 0)) &&
           ((dgEdgeCollapseEdgeHandle *)local_128 == *(dgEdgeCollapseEdgeHandle **)(lVar50 + 8))) {
          *(undefined8 *)(lVar50 + 8) = 0;
        }
      }
      pdVar47 = pdVar47->m_twin->m_next;
      pdVar34 = local_130;
    } while (pdVar47 != local_130);
    do {
      pdVar47 = pdVar34->m_twin;
      pdVar35 = pdVar47;
      local_88 = pdVar34;
      do {
        HVar3 = pdVar35->m_incidentVertex;
        HVar4 = pdVar35->m_twin->m_incidentVertex;
        if (pdVar35->m_mark != iVar45) {
          pdVar35->m_mark = iVar45;
          pdVar30 = (dgPolyhedra *)
                    dgStack<dgVertexCollapseVertexMetric>::operator[](&local_f0,HVar3);
          pdVar32 = &dgStack<dgBigVector>::operator[](&local_140,HVar4)->
                     super_dgTemplateVector<double>;
          auVar51 = vcvtpd2ps_avx((undefined1  [32])*pdVar32);
          auVar18._8_4_ = 0x7fffffff;
          auVar18._0_8_ = 0x7fffffff7fffffff;
          auVar18._12_4_ = 0x7fffffff;
          auVar52 = vpandd_avx512vl(auVar51,auVar18);
          auVar19._8_4_ = 0x7f7fffff;
          auVar19._0_8_ = 0x7f7fffff7f7fffff;
          auVar19._12_4_ = 0x7f7fffff;
          uVar43 = vpcmpgtd_avx512vl(auVar52,auVar19);
          local_128._0_4_ = auVar51._0_4_;
          local_128._4_4_ = auVar51._4_4_;
          fStack_120 = auVar51._8_4_;
          fStack_11c = auVar51._12_4_;
          if (((uVar43 & 0xf) != 0) || (auVar52 = vmovshdup_avx(auVar51), NAN(auVar52._0_4_)))
          goto LAB_0085c1fd;
          auVar52 = vshufpd_avx(auVar51,auVar51,1);
          auVar51 = vshufps_avx(auVar51,auVar51,0xff);
          if (NAN(auVar52._0_4_) || NAN(auVar51._0_4_)) goto LAB_0085c1fd;
          HVar64 = dgVertexCollapseVertexMetric::Evalue
                             ((dgVertexCollapseVertexMetric *)pdVar30,(dgVector *)local_128);
          if ((double)HVar64 < (double)local_100) {
            if (local_140.m_size < 0) goto LAB_0085c21c;
            HVar64 = EdgePenalty(pdVar30,(dgBigVector *)local_140.super_dgStackBase.m_ptr,pdVar35);
            if (0.0 < (double)HVar64) {
              local_128._0_4_ = 0.0;
              fStack_120 = SUB84(pdVar35,0);
              fStack_11c = (float)((ulong)pdVar35 >> 0x20);
              local_f8 = dgList<dgEdgeCollapseEdgeHandle>::Addtop
                                   ((dgList<dgEdgeCollapseEdgeHandle> *)local_b0,
                                    (dgEdgeCollapseEdgeHandle *)local_128);
              dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Push
                        (&local_d8,&local_f8,(double)HVar64);
              if ((((float)local_128._0_4_ != 0.0) &&
                  (lVar50 = CONCAT44(fStack_11c,fStack_120), lVar50 != 0)) &&
                 ((dgEdgeCollapseEdgeHandle *)local_128 ==
                  *(dgEdgeCollapseEdgeHandle **)(lVar50 + 8))) {
                *(undefined8 *)(lVar50 + 8) = 0;
              }
              goto LAB_0085c039;
            }
          }
          if (pdVar35->m_userData != 0) {
            *(undefined8 *)(pdVar35->m_userData + 8) = 0;
          }
          pdVar35->m_userData = 0;
        }
LAB_0085c039:
        pdVar34 = pdVar35->m_twin;
        if (pdVar34->m_mark != iVar45) {
          pdVar34->m_mark = iVar45;
          pdVar30 = (dgPolyhedra *)
                    dgStack<dgVertexCollapseVertexMetric>::operator[](&local_f0,HVar4);
          pdVar32 = &dgStack<dgBigVector>::operator[](&local_140,HVar3)->
                     super_dgTemplateVector<double>;
          auVar51 = vcvtpd2ps_avx((undefined1  [32])*pdVar32);
          auVar20._8_4_ = 0x7fffffff;
          auVar20._0_8_ = 0x7fffffff7fffffff;
          auVar20._12_4_ = 0x7fffffff;
          auVar52 = vpandd_avx512vl(auVar51,auVar20);
          auVar21._8_4_ = 0x7f7fffff;
          auVar21._0_8_ = 0x7f7fffff7f7fffff;
          auVar21._12_4_ = 0x7f7fffff;
          uVar43 = vpcmpgtd_avx512vl(auVar52,auVar21);
          local_128._0_4_ = auVar51._0_4_;
          local_128._4_4_ = auVar51._4_4_;
          fStack_120 = auVar51._8_4_;
          fStack_11c = auVar51._12_4_;
          if (((uVar43 & 0xf) != 0) || (auVar52 = vmovshdup_avx(auVar51), NAN(auVar52._0_4_)))
          goto LAB_0085c1fd;
          auVar52 = vshufpd_avx(auVar51,auVar51,1);
          auVar51 = vshufps_avx(auVar51,auVar51,0xff);
          if (NAN(auVar52._0_4_) || NAN(auVar51._0_4_)) goto LAB_0085c1fd;
          HVar64 = dgVertexCollapseVertexMetric::Evalue
                             ((dgVertexCollapseVertexMetric *)pdVar30,(dgVector *)local_128);
          if ((double)HVar64 < (double)local_100) {
            if (local_140.m_size < 0) goto LAB_0085c21c;
            HVar64 = EdgePenalty(pdVar30,(dgBigVector *)local_140.super_dgStackBase.m_ptr,
                                 pdVar35->m_twin);
            if (0.0 < (double)HVar64) {
              local_128._0_4_ = 0.0;
              fStack_120 = SUB84(pdVar35->m_twin,0);
              fStack_11c = (float)((ulong)pdVar35->m_twin >> 0x20);
              local_f8 = dgList<dgEdgeCollapseEdgeHandle>::Addtop
                                   ((dgList<dgEdgeCollapseEdgeHandle> *)local_b0,
                                    (dgEdgeCollapseEdgeHandle *)local_128);
              dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Push
                        (&local_d8,&local_f8,(double)HVar64);
              if ((((float)local_128._0_4_ != 0.0) &&
                  (lVar50 = CONCAT44(fStack_11c,fStack_120), lVar50 != 0)) &&
                 ((dgEdgeCollapseEdgeHandle *)local_128 ==
                  *(dgEdgeCollapseEdgeHandle **)(lVar50 + 8))) {
                *(undefined8 *)(lVar50 + 8) = 0;
              }
              pdVar34 = pdVar35->m_twin;
              goto LAB_0085c174;
            }
          }
          pdVar34 = pdVar35->m_twin;
          if (pdVar34->m_userData != 0) {
            *(undefined8 *)(pdVar34->m_userData + 8) = 0;
          }
          pdVar34->m_userData = 0;
        }
LAB_0085c174:
        pdVar35 = pdVar34->m_next;
      } while (pdVar35 != pdVar47);
      pdVar34 = local_88->m_twin->m_next;
    } while (pdVar34 != local_130);
  }
  goto LAB_0085c19c;
LAB_0085c21c:
  __function = "T &dgStack<dgBigVector>::operator[](hacd::HaI32) [T = dgBigVector]";
LAB_0085c231:
  __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,0x60,__function);
}

Assistant:

void dgPolyhedra::Optimize (const hacd::HaF64* const array, hacd::HaI32 strideInBytes, hacd::HaF64 tol)
{
	dgList <dgEdgeCollapseEdgeHandle>::dgListNode *handleNodePtr;

	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif

	hacd::HaI32 edgeCount = GetEdgeCount() * 4 + 1024 * 16;
	hacd::HaI32 maxVertexIndex = GetLastVertexIndex();

	dgStack<dgBigVector> vertexPool (maxVertexIndex); 
	dgStack<dgVertexCollapseVertexMetric> vertexMetrics (maxVertexIndex + 512); 

	dgList <dgEdgeCollapseEdgeHandle> edgeHandleList;
	dgStack<char> heapPool (2 * edgeCount * hacd::HaI32 (sizeof (hacd::HaF64) + sizeof (dgEdgeCollapseEdgeHandle*) + sizeof (hacd::HaI32))); 
	dgDownHeap<dgList <dgEdgeCollapseEdgeHandle>::dgListNode* , hacd::HaF64> bigHeapArray(&heapPool[0], heapPool.GetSizeInBytes());

	NormalizeVertex (maxVertexIndex, &vertexPool[0], array, stride);
	memset (&vertexMetrics[0], 0, maxVertexIndex * sizeof (dgVertexCollapseVertexMetric));
	CalculateAllMetrics (this, &vertexMetrics[0], &vertexPool[0]);


	hacd::HaF64 tol2 = tol * tol;
	Iterator iter (*this);
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);

		edge->m_userData = 0;
		hacd::HaI32 index0 = edge->m_incidentVertex;
		hacd::HaI32 index1 = edge->m_twin->m_incidentVertex;

		dgVertexCollapseVertexMetric &metric = vertexMetrics[index0];
		dgVector p	(&vertexPool[index1].m_x);
		hacd::HaF64 cost = metric.Evalue (p); 
		if (cost < tol2) {
			cost = EdgePenalty (&vertexPool[0], edge);

			if (cost > hacd::HaF64 (0.0f)) {
				dgEdgeCollapseEdgeHandle handle (edge);
				handleNodePtr = edgeHandleList.Addtop (handle);
				bigHeapArray.Push (handleNodePtr, cost);
			}
		}
	}


	while (bigHeapArray.GetCount()) {
		handleNodePtr = bigHeapArray[0];

		dgEdge* edge = handleNodePtr->GetInfo().m_edge;
		bigHeapArray.Pop();
		edgeHandleList.Remove (handleNodePtr);

		if (edge) {
			CalculateVertexMetrics (&vertexMetrics[0], &vertexPool[0], edge);

			hacd::HaI32 index0 = edge->m_incidentVertex;
			hacd::HaI32 index1 = edge->m_twin->m_incidentVertex;
			dgVertexCollapseVertexMetric &metric = vertexMetrics[index0];
			dgBigVector p (vertexPool[index1]);

			if ((metric.Evalue (p) < tol2) && (EdgePenalty (&vertexPool[0], edge)  > hacd::HaF64 (0.0f))) {

#ifdef __ENABLE_SANITY_CHECK 
				HACD_ASSERT (SanityCheck ());
#endif

				edge = CollapseEdge(this, edge);

#ifdef __ENABLE_SANITY_CHECK 
				HACD_ASSERT (SanityCheck ());
#endif
				if (edge) {
					// Update vertex metrics
					CalculateVertexMetrics (&vertexMetrics[0], &vertexPool[0], edge);

					// Update metrics for all surrounding vertex
					dgEdge* ptr = edge;
					do {
						CalculateVertexMetrics (&vertexMetrics[0], &vertexPool[0], ptr->m_twin);
						ptr = ptr->m_twin->m_next;
					} while (ptr != edge);

					// calculate edge cost of all incident edges
					hacd::HaI32 mark = IncLRU();
					ptr = edge;
					do {
						HACD_ASSERT (ptr->m_mark != mark);
						ptr->m_mark = mark;

						index0 = ptr->m_incidentVertex;
						index1 = ptr->m_twin->m_incidentVertex;

						dgVertexCollapseVertexMetric &metric = vertexMetrics[index0];
						dgBigVector p (vertexPool[index1]);

						hacd::HaF64 cost = hacd::HaF32 (-1.0f);
						if (metric.Evalue (p) < tol2) {
							cost = EdgePenalty (&vertexPool[0], ptr);
						}

						if (cost  > hacd::HaF64 (0.0f)) {
							dgEdgeCollapseEdgeHandle handle (ptr);
							handleNodePtr = edgeHandleList.Addtop (handle);
							bigHeapArray.Push (handleNodePtr, cost);
						} else {
							dgEdgeCollapseEdgeHandle* const handle = (dgEdgeCollapseEdgeHandle*)IntToPointer (ptr->m_userData);
							if (handle) {
								handle->m_edge = NULL;
							}
							ptr->m_userData = hacd::HaU64 (NULL);

						}

						ptr = ptr->m_twin->m_next;
					} while (ptr != edge);


					// calculate edge cost of all incident edges to a surrounding vertex
					ptr = edge;
					do {
						dgEdge* const incidentEdge = ptr->m_twin;		

						dgEdge* ptr1 = incidentEdge;
						do {
							index0 = ptr1->m_incidentVertex;
							index1 = ptr1->m_twin->m_incidentVertex;

							if (ptr1->m_mark != mark) {
								ptr1->m_mark = mark;
								dgVertexCollapseVertexMetric &metric = vertexMetrics[index0];
								dgBigVector p (vertexPool[index1]);

								hacd::HaF64 cost = hacd::HaF32 (-1.0f);
								if (metric.Evalue (p) < tol2) {
									cost = EdgePenalty (&vertexPool[0], ptr1);
								}

								if (cost  > hacd::HaF64 (0.0f)) {
									HACD_ASSERT (cost > hacd::HaF64(0.0f));
									dgEdgeCollapseEdgeHandle handle (ptr1);
									handleNodePtr = edgeHandleList.Addtop (handle);
									bigHeapArray.Push (handleNodePtr, cost);
								} else {
									dgEdgeCollapseEdgeHandle *handle;
									handle = (dgEdgeCollapseEdgeHandle*)IntToPointer (ptr1->m_userData);
									if (handle) {
										handle->m_edge = NULL;
									}
									ptr1->m_userData = hacd::HaU64 (NULL);

								}
							}

							if (ptr1->m_twin->m_mark != mark) {
								ptr1->m_twin->m_mark = mark;
								dgVertexCollapseVertexMetric &metric = vertexMetrics[index1];
								dgBigVector p (vertexPool[index0]);

								hacd::HaF64 cost = hacd::HaF32 (-1.0f);
								if (metric.Evalue (p) < tol2) {
									cost = EdgePenalty (&vertexPool[0], ptr1->m_twin);
								}

								if (cost  > hacd::HaF64 (0.0f)) {
									HACD_ASSERT (cost > hacd::HaF64(0.0f));
									dgEdgeCollapseEdgeHandle handle (ptr1->m_twin);
									handleNodePtr = edgeHandleList.Addtop (handle);
									bigHeapArray.Push (handleNodePtr, cost);
								} else {
									dgEdgeCollapseEdgeHandle *handle;
									handle = (dgEdgeCollapseEdgeHandle*) IntToPointer (ptr1->m_twin->m_userData);
									if (handle) {
										handle->m_edge = NULL;
									}
									ptr1->m_twin->m_userData = hacd::HaU64 (NULL);

								}
							}

							ptr1 = ptr1->m_twin->m_next;
						} while (ptr1 != incidentEdge);

						ptr = ptr->m_twin->m_next;
					} while (ptr != edge);
				}
			}
		}
	}
}